

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryScene(AssbinExport *this,IOStream *container,aiScene *scene)

{
  uint *puVar1;
  uint *puVar2;
  uint i;
  ulong uVar3;
  uint i_2;
  uint i_1;
  AssbinChunkWriter chunk;
  AssbinChunkWriter local_88;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  
  local_88.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  local_88.buffer = (uint8_t *)0x0;
  local_88.magic = 0x1239;
  local_88.cur_size = 0;
  local_88.cursor = 0;
  local_88.initial = 0x1000;
  local_88.container = container;
  Write<unsigned_int>(&local_88.super_IOStream,&scene->mFlags);
  Write<unsigned_int>(&local_88.super_IOStream,&scene->mNumMeshes);
  Write<unsigned_int>(&local_88.super_IOStream,&scene->mNumMaterials);
  local_38 = &scene->mNumAnimations;
  Write<unsigned_int>(&local_88.super_IOStream,local_38);
  local_40 = &scene->mNumTextures;
  Write<unsigned_int>(&local_88.super_IOStream,local_40);
  local_48 = &scene->mNumLights;
  Write<unsigned_int>(&local_88.super_IOStream,local_48);
  local_50 = &scene->mNumCameras;
  Write<unsigned_int>(&local_88.super_IOStream,local_50);
  WriteBinaryNode(this,&local_88.super_IOStream,scene->mRootNode);
  for (uVar3 = 0; puVar2 = local_48, uVar3 < scene->mNumMeshes; uVar3 = uVar3 + 1) {
    WriteBinaryMesh(this,&local_88.super_IOStream,scene->mMeshes[uVar3]);
  }
  for (uVar3 = 0; puVar1 = local_50, uVar3 < scene->mNumMaterials; uVar3 = uVar3 + 1) {
    WriteBinaryMaterial(this,&local_88.super_IOStream,scene->mMaterials[uVar3]);
  }
  for (uVar3 = 0; uVar3 < *local_38; uVar3 = uVar3 + 1) {
    WriteBinaryAnim(this,&local_88.super_IOStream,scene->mAnimations[uVar3]);
  }
  for (uVar3 = 0; uVar3 < *local_40; uVar3 = uVar3 + 1) {
    WriteBinaryTexture(this,&local_88.super_IOStream,scene->mTextures[uVar3]);
  }
  for (uVar3 = 0; uVar3 < *puVar2; uVar3 = uVar3 + 1) {
    WriteBinaryLight(this,&local_88.super_IOStream,scene->mLights[uVar3]);
  }
  for (uVar3 = 0; uVar3 < *puVar1; uVar3 = uVar3 + 1) {
    WriteBinaryCamera(this,&local_88.super_IOStream,scene->mCameras[uVar3]);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_88);
  return;
}

Assistant:

void WriteBinaryScene( IOStream * container, const aiScene* scene)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AISCENE );

        // basic scene information
        Write<unsigned int>(&chunk,scene->mFlags);
        Write<unsigned int>(&chunk,scene->mNumMeshes);
        Write<unsigned int>(&chunk,scene->mNumMaterials);
        Write<unsigned int>(&chunk,scene->mNumAnimations);
        Write<unsigned int>(&chunk,scene->mNumTextures);
        Write<unsigned int>(&chunk,scene->mNumLights);
        Write<unsigned int>(&chunk,scene->mNumCameras);

        // write node graph
        WriteBinaryNode( &chunk, scene->mRootNode );

        // write all meshes
        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            const aiMesh* mesh = scene->mMeshes[i];
            WriteBinaryMesh( &chunk,mesh);
        }

        // write materials
        for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
            const aiMaterial* mat = scene->mMaterials[i];
            WriteBinaryMaterial(&chunk,mat);
        }

        // write all animations
        for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
            const aiAnimation* anim = scene->mAnimations[i];
            WriteBinaryAnim(&chunk,anim);
        }


        // write all textures
        for (unsigned int i = 0; i < scene->mNumTextures;++i) {
            const aiTexture* mesh = scene->mTextures[i];
            WriteBinaryTexture(&chunk,mesh);
        }

        // write lights
        for (unsigned int i = 0; i < scene->mNumLights;++i) {
            const aiLight* l = scene->mLights[i];
            WriteBinaryLight(&chunk,l);
        }

        // write cameras
        for (unsigned int i = 0; i < scene->mNumCameras;++i) {
            const aiCamera* cam = scene->mCameras[i];
            WriteBinaryCamera(&chunk,cam);
        }

    }